

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MeanSquaredErrorLossLayer::CopyFrom
          (MeanSquaredErrorLossLayer *this,MeanSquaredErrorLossLayer *from)

{
  MeanSquaredErrorLossLayer *from_local;
  MeanSquaredErrorLossLayer *this_local;
  
  if (from != this) {
    Clear(this);
    MergeFrom(this,from);
  }
  return;
}

Assistant:

void MeanSquaredErrorLossLayer::CopyFrom(const MeanSquaredErrorLossLayer& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.MeanSquaredErrorLossLayer)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}